

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_details::xr_scene_details(xr_scene_details *this,xr_scene *scene)

{
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR___cxa_pure_virtual_00249928;
  (this->super_xr_scene_part).m_scene = scene;
  (this->super_xr_scene_part).m_file_name = "detail_object.part";
  (this->super_xr_scene_part).m_chunk_id = SCENE_CHUNK_DETAIL_OBJECTS;
  xr_scene_revision::xr_scene_revision(&(this->super_xr_scene_part).m_revision);
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_details_00249960;
  this->m_flags = 0x10000000;
  (this->m_header).version = 3;
  *(undefined8 *)&this->m_num_slots = 0;
  *(undefined8 *)((long)&this->m_slots + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_objects).
           super__Vector_base<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_objects).
           super__Vector_base<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_objects).
           super__Vector_base<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_indices).
           super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->m_indices).
  super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indices).
  super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_density = 0.2;
  (this->m_texture)._M_dataplus._M_p = (pointer)&(this->m_texture).field_2;
  (this->m_texture)._M_string_length = 0;
  (this->m_texture).field_2._M_local_buf[0] = '\0';
  (this->m_snap_objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_snap_objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_snap_objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_header).object_count = 0;
  (this->m_header).offs_x = 0;
  (this->m_header).offs_z = 0;
  (this->m_header).size_x = 0;
  (this->m_header).size_z = 0;
  return;
}

Assistant:

xr_scene_details::xr_scene_details(xr_scene& scene):
	xr_scene_part(scene, "detail_object.part", SCENE_CHUNK_DETAIL_OBJECTS),
	m_flags(DETMGR_FLAG_DRAW_OBJECTS), m_num_slots(0), m_slots(0),
	m_density(0.2f)
{
	m_header.version = DETMGR_VERSION;
	m_header.object_count = 0;
	m_header.offs_x = 0;
	m_header.offs_z = 0;
	m_header.size_x = 0;
	m_header.size_z = 0;
}